

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

void spvInstructionCopy(uint32_t *words,Op opcode,uint16_t wordCount,spv_endianness_t endian,
                       spv_instruction_t *pInst)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  ushort local_2e;
  ushort local_2c;
  ushort local_2a;
  uint16_t thisOpcode;
  uint16_t thisWordCount;
  spv_instruction_t *psStack_28;
  uint16_t wordIndex;
  spv_instruction_t *pInst_local;
  uint16_t local_16;
  spv_endianness_t endian_local;
  uint16_t wordCount_local;
  uint32_t *puStack_10;
  Op opcode_local;
  uint32_t *words_local;
  
  pInst->opcode = opcode;
  psStack_28 = pInst;
  pInst_local._4_4_ = endian;
  local_16 = wordCount;
  endian_local = opcode;
  puStack_10 = words;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(&pInst->words,(ulong)wordCount);
  local_2a = 0;
  do {
    if (local_16 <= local_2a) {
      return;
    }
    uVar2 = spvFixWord(puStack_10[local_2a],pInst_local._4_4_);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&psStack_28->words,(ulong)local_2a);
    *pvVar3 = uVar2;
    if (local_2a == 0) {
      pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&psStack_28->words,0);
      spvOpcodeSplit(*pvVar3,&local_2c,&local_2e);
      bVar1 = false;
      if ((endian_local == local_2e) && (bVar1 = false, local_16 == local_2c)) {
        bVar1 = true;
      }
      if (!bVar1) {
        __assert_fail("opcode == static_cast<spv::Op>(thisOpcode) && wordCount == thisWordCount && \"Endianness failed!\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opcode.cpp"
                      ,0xca,
                      "void spvInstructionCopy(const uint32_t *, const spv::Op, const uint16_t, const spv_endianness_t, spv_instruction_t *)"
                     );
      }
    }
    local_2a = local_2a + 1;
  } while( true );
}

Assistant:

void spvInstructionCopy(const uint32_t* words, const spv::Op opcode,
                        const uint16_t wordCount, const spv_endianness_t endian,
                        spv_instruction_t* pInst) {
  pInst->opcode = opcode;
  pInst->words.resize(wordCount);
  for (uint16_t wordIndex = 0; wordIndex < wordCount; ++wordIndex) {
    pInst->words[wordIndex] = spvFixWord(words[wordIndex], endian);
    if (!wordIndex) {
      uint16_t thisWordCount;
      uint16_t thisOpcode;
      spvOpcodeSplit(pInst->words[wordIndex], &thisWordCount, &thisOpcode);
      assert(opcode == static_cast<spv::Op>(thisOpcode) &&
             wordCount == thisWordCount && "Endianness failed!");
    }
  }
}